

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

uint8 * __thiscall
Messages::AddressBook::_InternalSerialize
          (AddressBook *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  uint8 *puVar3;
  Person *this_00;
  Container<google::protobuf::UnknownFieldSet> *pCVar4;
  uint local_a0;
  uint n;
  uint i;
  uint32 cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  AddressBook *this_local;
  UnknownFieldSet *local_68;
  
  local_a0 = 0;
  uVar1 = _internal_people_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_a0 < uVar1; local_a0 = local_a0 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    this_00 = _internal_people(this,local_a0);
    uVar2 = google::protobuf::internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    uVar2 = Person::GetCachedSize(this_00);
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar3);
    stream_local = (EpsCopyOutputStream *)Person::_InternalSerialize(this_00,puVar3,stream);
  }
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
      pCVar4 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)&this->field_0x8);
      local_68 = &pCVar4->unknown_fields;
    }
    else {
      local_68 = (UnknownFieldSet *)google::protobuf::UnknownFieldSet::default_instance();
    }
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (local_68,(uchar *)stream_local,stream);
  }
  return (uint8 *)stream_local;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* AddressBook::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:Messages.AddressBook)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .Messages.Person people = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_people_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_people(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:Messages.AddressBook)
  return target;
}